

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O3

size_t ctemplate::Template::InsertLine
                 (char *line,size_t len,Strip strip,MarkerDelimiters *delim,char *buffer)

{
  bool bVar1;
  byte bVar2;
  size_t __n;
  size_t local_30;
  char *local_28;
  
  bVar2 = 1;
  if (len == 0) {
    __n = 0;
    local_30 = len;
  }
  else {
    __n = len;
    local_30 = len;
    if (line[len - 1] == '\n') {
      __n = len - 1;
      bVar2 = 0;
      local_30 = __n;
    }
  }
  local_28 = line;
  if ((int)strip < 2) {
    if (strip == STRIP_BLANK_LINES) {
      bVar1 = IsBlankOrOnlyHasOneRemovableMarker(&local_28,&local_30,delim);
      bVar2 = bVar2 | bVar1;
      __n = local_30;
    }
    memcpy(buffer,local_28,__n);
    if (bVar2 == 0) {
      buffer[__n] = '\n';
      __n = __n + 1;
    }
  }
  else {
    StripTemplateWhiteSpace(&local_28,&local_30);
    __n = local_30;
    memcpy(buffer,local_28,local_30);
  }
  return __n;
}

Assistant:

size_t Template::InsertLine(const char *line, size_t len, Strip strip,
                            const MarkerDelimiters& delim, char* buffer) {
  bool add_newline = (len > 0 && line[len-1] == '\n');
  if (add_newline)
    len--;                 // so we ignore the newline from now on

  if (strip >= STRIP_WHITESPACE) {
    StripTemplateWhiteSpace(&line, &len);
    add_newline = false;

    // IsBlankOrOnlyHasOneRemovableMarker may modify the two input
    // parameters if the line contains only spaces or only one input
    // marker.  This modification must be done before the line is
    // written to the input buffer. Hence the need for the boolean flag
    // add_newline to be referenced after the Write statement.
  } else if (strip >= STRIP_BLANK_LINES
             && IsBlankOrOnlyHasOneRemovableMarker(&line, &len, delim)) {
    add_newline = false;
  }

  memcpy(buffer, line, len);

  if (add_newline) {
    buffer[len++] = '\n';
  }
  return len;
}